

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O2

void rehash(ecs_map_t *map,int32_t bucket_count)

{
  ecs_bucket_t *bucket;
  ecs_size_t elem_size;
  ecs_bucket_t *peVar1;
  ecs_map_key_t *peVar2;
  void *pvVar3;
  ecs_map_key_t key;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  int index;
  
  uVar6 = (ulong)(uint)bucket_count;
  _ecs_assert(bucket_count != 0,0xc,(char *)0x0,"bucket_count != 0",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/map.c"
              ,0xc1);
  if (bucket_count == 0) {
    __assert_fail("bucket_count != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/map.c"
                  ,0xc1,"void rehash(ecs_map_t *, int32_t)");
  }
  _ecs_assert(map->bucket_count < bucket_count,0xc,(char *)0x0,"bucket_count > map->bucket_count",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/map.c"
              ,0xc2);
  if (bucket_count <= map->bucket_count) {
    __assert_fail("bucket_count > map->bucket_count",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/map.c"
                  ,0xc2,"void rehash(ecs_map_t *, int32_t)");
  }
  elem_size = map->elem_size;
  ensure_buckets(map,bucket_count);
  peVar1 = map->buckets;
  _ecs_assert(peVar1 != (ecs_bucket_t *)0x0,0xc,(char *)0x0,"buckets != NULL",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/map.c"
              ,0xc9);
  if (peVar1 == (ecs_bucket_t *)0x0) {
    __assert_fail("buckets != ((void*)0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/map.c"
                  ,0xc9,"void rehash(ecs_map_t *, int32_t)");
  }
  while (0 < (int)uVar6) {
    uVar6 = uVar6 - 1;
    bucket = peVar1 + uVar6;
    iVar5 = peVar1[uVar6].count;
    peVar2 = peVar1[uVar6].keys;
    pvVar3 = peVar1[uVar6].payload;
    for (index = 0; index < iVar5; index = index + 1) {
      key = peVar2[index];
      uVar4 = get_bucket_id(bucket_count,key);
      if (uVar6 != uVar4) {
        add_to_bucket(peVar1 + uVar4,elem_size,key,
                      (void *)((long)(index * elem_size) + (long)pvVar3));
        remove_from_bucket(bucket,elem_size,key,index);
        iVar5 = iVar5 + -1;
        index = index + -1;
      }
    }
    if (bucket->count == 0) {
      clear_bucket(bucket);
    }
  }
  return;
}

Assistant:

static
void rehash(
    ecs_map_t *map,
    int32_t bucket_count)
{
    ecs_assert(bucket_count != 0, ECS_INTERNAL_ERROR, NULL);
    ecs_assert(bucket_count > map->bucket_count, ECS_INTERNAL_ERROR, NULL);

    ecs_size_t elem_size = map->elem_size;

    ensure_buckets(map, bucket_count);

    ecs_bucket_t *buckets = map->buckets;
    ecs_assert(buckets != NULL, ECS_INTERNAL_ERROR, NULL);
    
    int32_t bucket_id;

    /* Iterate backwards as elements could otherwise be moved to existing
        * buckets which could temporarily cause the number of elements in a
        * bucket to exceed BUCKET_COUNT. */
    for (bucket_id = bucket_count - 1; bucket_id >= 0; bucket_id --) {
        ecs_bucket_t *bucket = &buckets[bucket_id];

        int i, count = bucket->count;
        ecs_map_key_t *key_array = bucket->keys;
        void *payload_array = bucket->payload;

        for (i = 0; i < count; i ++) {
            ecs_map_key_t key = key_array[i];
            void *elem = GET_ELEM(payload_array, elem_size, i);
            int32_t new_bucket_id = get_bucket_id(bucket_count, key);

            if (new_bucket_id != bucket_id) {
                ecs_bucket_t *new_bucket = &buckets[new_bucket_id];

                add_to_bucket(new_bucket, elem_size, key, elem);
                remove_from_bucket(bucket, elem_size, key, i);

                count --;
                i --;
            }
        }

        if (!bucket->count) {
            clear_bucket(bucket);
        }
    }
}